

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O2

void TTD::NSSnapValues::EmitTTDVar(TTDVar var,FileWriter *writer,Separator separator)

{
  bool bVar1;
  int32 val;
  undefined7 in_register_00000011;
  double val_00;
  
  (*writer->_vptr_FileWriter[6])(writer,CONCAT71(in_register_00000011,separator) & 0xffffffff);
  if (var == (TTDVar)0x0) {
    FileWriter::WriteTag<TTD::NSSnapValues::TTDVarEmitTag>(writer,ttdVarTag,TTDVarNull,NoSeparator);
    FileWriter::WriteNull(writer,nullVal,CommaSeparator);
  }
  else {
    bVar1 = Js::TaggedNumber::Is(var);
    if (bVar1) {
      bVar1 = Js::TaggedInt::Is(var);
      if (bVar1) {
        FileWriter::WriteTag<TTD::NSSnapValues::TTDVarEmitTag>
                  (writer,ttdVarTag,TTDVarInt,NoSeparator);
        val = Js::TaggedInt::ToInt32(var);
        FileWriter::WriteInt32(writer,i32Val,val,CommaSeparator);
      }
      else {
        if ((ulong)var >> 0x32 == 0) {
          TTDAbort_unrecoverable_error("Only other tagged value we support!!!");
        }
        FileWriter::WriteTag<TTD::NSSnapValues::TTDVarEmitTag>
                  (writer,ttdVarTag,TTDVarDouble,NoSeparator);
        val_00 = Js::JavascriptNumber::GetValue(var);
        FileWriter::WriteDouble(writer,doubleVal,val_00,CommaSeparator);
      }
    }
    else {
      FileWriter::WriteTag<TTD::NSSnapValues::TTDVarEmitTag>
                (writer,ttdVarTag,TTDVarAddr,NoSeparator);
      FileWriter::WriteAddr(writer,ptrIdVal,(TTD_PTR_ID)var,CommaSeparator);
    }
  }
  (*writer->_vptr_FileWriter[7])(writer,0);
  return;
}

Assistant:

void EmitTTDVar(TTDVar var, FileWriter* writer, NSTokens::Separator separator)
        {
            writer->WriteRecordStart(separator);

            if(var == nullptr)
            {
                writer->WriteTag<TTDVarEmitTag>(NSTokens::Key::ttdVarTag, TTDVarEmitTag::TTDVarNull);
                writer->WriteNull(NSTokens::Key::nullVal, NSTokens::Separator::CommaSeparator);
            }
            else if(Js::TaggedNumber::Is(var))
            {
#if FLOATVAR
                if(Js::TaggedInt::Is(var))
                {
#endif
                    writer->WriteTag<TTDVarEmitTag>(NSTokens::Key::ttdVarTag, TTDVarEmitTag::TTDVarInt);
                    writer->WriteInt32(NSTokens::Key::i32Val, Js::TaggedInt::ToInt32(var), NSTokens::Separator::CommaSeparator);
#if FLOATVAR
                }
                else
                {
                    TTDAssert(Js::JavascriptNumber::Is_NoTaggedIntCheck(var), "Only other tagged value we support!!!");

                    writer->WriteTag<TTDVarEmitTag>(NSTokens::Key::ttdVarTag, TTDVarEmitTag::TTDVarDouble);
                    writer->WriteDouble(NSTokens::Key::doubleVal, Js::JavascriptNumber::GetValue(var), NSTokens::Separator::CommaSeparator);
                }
#endif
            }
            else
            {
                writer->WriteTag<TTDVarEmitTag>(NSTokens::Key::ttdVarTag, TTDVarEmitTag::TTDVarAddr);
                writer->WriteAddr(NSTokens::Key::ptrIdVal, TTD_CONVERT_VAR_TO_PTR_ID(var), NSTokens::Separator::CommaSeparator);
            }

            writer->WriteRecordEnd();
        }